

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::option::cla_name_help
          (option *this,ostream *ostr,cstring *cla_tag,cstring *negation_prefix_)

{
  ostream *os;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  
  if (negation_prefix_->m_end != negation_prefix_->m_begin) {
    os = std::operator<<(ostr,'[');
    pbVar1 = unit_test::operator<<(os,negation_prefix_);
    ostr = std::operator<<(pbVar1,']');
  }
  unit_test::operator<<(ostr,cla_tag);
  return;
}

Assistant:

virtual void    cla_name_help( std::ostream& ostr, cstring cla_tag, cstring negation_prefix_ ) const
    {
        if( negation_prefix_.is_empty() )
            ostr << cla_tag;
        else
            ostr << '[' << negation_prefix_ << ']' << cla_tag;
    }